

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O0

void __thiscall
TPZCompElDisc::TPZCompElDisc
          (TPZCompElDisc *this,void **vtt,TPZCompMesh *mesh,TPZCompElDisc *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  bool bVar1;
  TPZIntPoints *rval;
  long *in_RCX;
  TPZCompElDisc *in_RSI;
  long *in_RDI;
  TPZAutoPointer<TPZFunction<double>_> *in_stack_ffffffffffffff68;
  TPZAutoPointer<TPZFunction<double>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  TPZCompMesh *in_stack_ffffffffffffff80;
  _func_int **pp_Var2;
  void **in_stack_ffffffffffffff88;
  TPZInterpolationSpace *in_stack_ffffffffffffff90;
  TPZAutoPointer<TPZIntPoints> *this_00;
  TPZManVector<double,_3> *copy_00;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *this_01;
  
  TPZInterpolationSpace::TPZInterpolationSpace
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (TPZInterpolationSpace *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78))
  ;
  *in_RDI = (long)*(_func_int ***)&(in_RSI->super_TPZInterpolationSpace).super_TPZCompEl;
  *(undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) =
       *(undefined8 *)&(in_RSI->super_TPZInterpolationSpace).fPreferredOrder;
  this_01 = (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
            (in_RDI + 6);
  TPZAutoPointer<TPZIntPoints>::TPZAutoPointer
            ((TPZAutoPointer<TPZIntPoints> *)in_stack_ffffffffffffff80);
  in_RDI[8] = -1;
  copy_00 = (TPZManVector<double,_3> *)(in_RDI + 0xb);
  TPZAutoPointer<TPZFunction<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZFunction<double>_> *)in_stack_ffffffffffffff80);
  this_00 = (TPZAutoPointer<TPZIntPoints> *)(in_RDI + 0xc);
  TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)in_RSI,copy_00);
  *(int *)(in_RDI + 7) = (int)in_RCX[7];
  pp_Var2 = (_func_int **)in_RCX[2];
  rval = (TPZIntPoints *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[](this_01,in_RDI);
  rval->_vptr_TPZIntPoints = pp_Var2;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RCX + 6));
  if (bVar1) {
    in_stack_ffffffffffffff70 =
         (TPZAutoPointer<TPZFunction<double>_> *)(**(code **)(*in_RCX + 0x240))();
    in_stack_ffffffffffffff68 =
         (TPZAutoPointer<TPZFunction<double>_> *)
         (**(code **)&in_stack_ffffffffffffff70->fRef[4].fCounter)();
    TPZAutoPointer<TPZIntPoints>::operator=(this_00,rval);
  }
  else {
    TPZAutoPointer<TPZIntPoints>::operator=(this_00,rval);
  }
  TPZAutoPointer<TPZFunction<double>_>::TPZAutoPointer
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  SetExternalShapeFunction(in_RSI,(TPZAutoPointer<TPZFunction<double>_> *)copy_00);
  TPZAutoPointer<TPZFunction<double>_>::~TPZAutoPointer(in_stack_ffffffffffffff70);
  *(byte *)(in_RDI + 10) = *(byte *)(in_RCX + 10) & 1;
  return;
}

Assistant:

TPZCompElDisc::TPZCompElDisc(TPZCompMesh &mesh,
                             const TPZCompElDisc &copy,
                             std::map<int64_t,int64_t> &gl2lcConMap,
                             std::map<int64_t,int64_t> &gl2lcElMap) : 
TPZRegisterClassId(&TPZCompElDisc::ClassId),TPZInterpolationSpace(mesh,copy), fConnectIndex(-1), fCenterPoint(copy.fCenterPoint)
{
	fShapefunctionType = copy.fShapefunctionType;
	//TPZMaterial * mat = copy.Material();
	gl2lcElMap[this->fIndex] = copy.fIndex;
	
	if (copy.fIntRule){
		this->fIntRule = copy.GetIntegrationRule().Clone();
	}
	else{
		this->fIntRule = NULL;
	}
	
	this->SetExternalShapeFunction(copy.fExternalShape);
    fUseQsiEta = copy.fUseQsiEta;
}